

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraKateGenerator::GetPathBasename
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,string *path)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  string local_60 [32];
  long local_40;
  size_type loc;
  undefined1 local_21;
  string *local_20;
  string *path_local;
  cmExtraKateGenerator *this_local;
  string *outputBasename;
  
  local_21 = 0;
  local_20 = path;
  path_local = (string *)this;
  this_local = (cmExtraKateGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar3 = false;
    if ((uVar1 & 1) == 0) {
      pcVar2 = (char *)std::__cxx11::string::back();
      bVar3 = true;
      if (*pcVar2 != '/') {
        pcVar2 = (char *)std::__cxx11::string::back();
        bVar3 = *pcVar2 == '\\';
      }
    }
    if (!bVar3) break;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  local_40 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0xd48b28);
  if (local_40 != -1) {
    std::__cxx11::string::substr((ulong)local_60,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GetPathBasename(
  const std::string& path) const
{
  std::string outputBasename = path;
  while (!outputBasename.empty() &&
         (outputBasename.back() == '/' || outputBasename.back() == '\\')) {
    outputBasename.resize(outputBasename.size() - 1);
  }
  std::string::size_type loc = outputBasename.find_last_of("/\\");
  if (loc != std::string::npos) {
    outputBasename = outputBasename.substr(loc + 1);
  }

  return outputBasename;
}